

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

timestamp_t __thiscall lsim::Simulator::pin_last_change_time(Simulator *this,pin_t pin)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_pin_nodes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)pin) {
    __assert_fail("pin < m_pin_nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x72,"timestamp_t lsim::Simulator::pin_last_change_time(pin_t) const");
  }
  uVar3 = (ulong)puVar1[pin];
  puVar2 = (this->m_node_change_time).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->m_node_change_time).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    return puVar2[uVar3];
  }
  __assert_fail("node_id < m_node_change_time.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xfb,"timestamp_t lsim::Simulator::node_last_change_time(node_t) const");
}

Assistant:

timestamp_t Simulator::pin_last_change_time(pin_t pin) const {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    return node_last_change_time(node_id);
}